

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void Bpputrast(char *fn,float *bf,int sx,int sy,int r)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uchar c;
  long local_40;
  ulong local_38;
  
  iVar1 = creat(fn,0x180);
  if (iVar1 < 1) {
    iVar1 = 9;
LAB_001026e4:
    error(iVar1);
  }
  uVar3 = 0;
  if (sx < 1) {
    sx = 0;
  }
  if (sy < 1) {
    sy = 0;
  }
  local_38 = (ulong)(uint)sy;
  local_40 = (long)r << 2;
  do {
    if (uVar3 == local_38) {
      close(iVar1);
      return;
    }
    uVar4 = 0;
    while ((uint)sx != uVar4) {
      c = (uchar)(int)bf[uVar4];
      sVar2 = write(iVar1,&c,1);
      uVar4 = uVar4 + 1;
      if (sVar2 != 1) {
        iVar1 = 7;
        goto LAB_001026e4;
      }
    }
    uVar3 = uVar3 + 1;
    bf = (float *)((long)bf + local_40);
  } while( true );
}

Assistant:

void Bpputrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        c = (unsigned char)bf[r*i + j] ;
        if (write(fd,&c,sizeof(c)) != 1) {
          error(7) ;
        }
      }
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}